

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ResultType *rt)

{
  CWriter *this_00;
  Type *pTVar1;
  TypeVector *in_RDX;
  string local_30;
  
  this_00 = (CWriter *)rt->types;
  pTVar1 = *(Type **)&this_00->field_0x0;
  if (pTVar1 == *(Type **)(this_00 + 8)) {
    WriteData(this,"void",4);
    return;
  }
  if ((long)*(Type **)(this_00 + 8) - (long)pTVar1 == 8) {
    Write(this,*pTVar1);
    return;
  }
  (anonymous_namespace)::CWriter::MangleMultivalueTypes_abi_cxx11_(&local_30,this_00,in_RDX);
  WriteData(this,"struct ",7);
  WriteData(this,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CWriter::Write(const ResultType& rt) {
  if (rt.types.empty()) {
    Write("void");
  } else if (rt.types.size() == 1) {
    Write(rt.types[0]);
  } else {
    Write("struct ", MangleMultivalueTypes(rt.types));
  }
}